

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ReduceProdLayerParams::ByteSizeLong(ReduceProdLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  int value;
  
  sVar1 = google::protobuf::internal::WireFormatLite::Int64Size(&this->axes_);
  if (sVar1 == 0) {
    value = 0;
    lVar3 = 0;
  }
  else {
    value = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar3 = sVar2 + 1;
  }
  this->_axes_cached_byte_size_ = value;
  sVar2 = lVar3 + sVar1 + 2;
  if (this->keepdims_ == false) {
    sVar2 = lVar3 + sVar1;
  }
  sVar1 = sVar2 + 2;
  if (this->reduceall_ == false) {
    sVar1 = sVar2;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t ReduceProdLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ReduceProdLayerParams)
  size_t total_size = 0;

  // repeated int64 axes = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->axes_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _axes_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // bool keepDims = 2;
  if (this->keepdims() != 0) {
    total_size += 1 + 1;
  }

  // bool reduceAll = 3;
  if (this->reduceall() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}